

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

void __thiscall
soul::SourceCodeUtilities::findRangeOfASTObject(soul::AST::ASTObject&)::FindLexicalRangeVisitor::
visitObject(soul::AST::ASTObject__(void *this,ASTObject *o)

{
  CodeLocation loc;
  CodeLocation local_20;
  
  ASTVisitor::visitObject((ASTVisitor *)this,o);
  local_20.sourceCode.object = (o->context).location.sourceCode.object;
  if (local_20.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_20.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_20.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_20.location.data = (o->context).location.location.data;
  if (local_20.location.data < *(char **)((long)this + 0x10)) {
    CodeLocation::operator=((CodeLocation *)((long)this + 8),&local_20);
  }
  if (*(char **)((long)this + 0x20) < local_20.location.data) {
    CodeLocation::operator=((CodeLocation *)((long)this + 0x18),&local_20);
  }
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_20.sourceCode);
  return;
}

Assistant:

void visitObject (AST::ASTObject& o) override
        {
            ASTVisitor::visitObject (o);

            auto loc = o.context.location;

            if (loc.location < range.start.location)  range.start = loc;
            if (loc.location > range.end.location)    range.end = loc;
        }